

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_strchar(char *str,char ch)

{
  ulong uVar1;
  uintptr_t uVar2;
  ulong uVar3;
  uint8_t *cp;
  uint8_t c;
  uintptr_t charmask;
  uintptr_t magic_bits;
  uintptr_t longword;
  uintptr_t *longword_ptr;
  uint8_t *char_ptr;
  char ch_local;
  char *str_local;
  
  for (longword_ptr = (uintptr_t *)str; ((ulong)longword_ptr & 7) != 0;
      longword_ptr = (uintptr_t *)((long)longword_ptr + 1)) {
    if ((char)*longword_ptr == ch) {
      return (char *)longword_ptr;
    }
    if ((char)*longword_ptr == '\0') {
      return (char *)0x0;
    }
  }
  longword = (uintptr_t)longword_ptr;
  uVar3 = (long)(int)(uint)CONCAT11(ch,ch) << 0x10 | (long)(int)(uint)CONCAT11(ch,ch);
  uVar3 = uVar3 << 0x20 | uVar3;
  uVar2 = longword;
LAB_0010a5bb:
  do {
    longword = uVar2;
    uVar1 = *(ulong *)longword;
    uVar2 = longword + 8;
    if (((uVar1 + 0x7efefefefefefeff ^ uVar1 ^ 0xffffffffffffffff) & 0x8101010101010100) == 0) {
      if ((((uVar1 ^ uVar3) + 0x7efefefefefefeff ^ uVar1 ^ uVar3 ^ 0xffffffffffffffff) &
          0x8101010101010100) == 0) goto LAB_0010a5bb;
    }
    if (*(char *)longword == ch) {
      return (char *)longword;
    }
    if (*(char *)longword == '\0') {
      return (char *)0x0;
    }
    if (*(char *)(longword + 1) == ch) {
      return (char *)(longword + 1);
    }
    if (*(char *)(longword + 1) == '\0') {
      return (char *)0x0;
    }
    if (*(char *)(longword + 2) == ch) {
      return (char *)(longword + 2);
    }
    if (*(char *)(longword + 2) == '\0') {
      return (char *)0x0;
    }
    if (*(char *)(longword + 3) == ch) {
      return (char *)(longword + 3);
    }
    if (*(char *)(longword + 3) == '\0') {
      return (char *)0x0;
    }
    if (*(char *)(longword + 4) == ch) {
      return (char *)(longword + 4);
    }
    if (*(char *)(longword + 4) == '\0') {
      return (char *)0x0;
    }
    if (*(char *)(longword + 5) == ch) {
      return (char *)(longword + 5);
    }
    if (*(char *)(longword + 5) == '\0') {
      return (char *)0x0;
    }
    if (*(char *)(longword + 6) == ch) {
      return (char *)(longword + 6);
    }
    if (*(char *)(longword + 6) == '\0') {
      return (char *)0x0;
    }
    if (*(char *)(longword + 7) == ch) {
      return (char *)(longword + 7);
    }
    if (*(char *)(longword + 7) == '\0') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* sx_strchar(const char* str, char ch)
{
    const uint8_t* char_ptr;
    uintptr_t* longword_ptr;
    uintptr_t longword, magic_bits, charmask;
    uint8_t c = (uint8_t)ch;

    // Handle the first few characters by reading one character at a time.
    // Do this until CHAR_PTR is aligned on a longword boundary.
    for (char_ptr = (const uint8_t*)str; ((uintptr_t)char_ptr & (sizeof(longword) - 1)) != 0;
         ++char_ptr) {
        if (*char_ptr == c)
            return (const char*)char_ptr;
        else if (*char_ptr == '\0')
            return NULL;
    }

    longword_ptr = (uintptr_t*)char_ptr;
    magic_bits = (uintptr_t)-1;
    magic_bits = magic_bits / 0xff * 0xfe << 1 >> 1 | 1;
    charmask = c | (c << 8);
    charmask |= charmask << 16;
#if SX_ARCH_64BIT
    charmask |= (charmask << 16) << 16;
#endif

    for (;;) {
        longword = *longword_ptr++;

        if ((((longword + magic_bits) ^ ~longword) & ~magic_bits) != 0 ||
            ((((longword ^ charmask) + magic_bits) ^ ~(longword ^ charmask)) & ~magic_bits) != 0) {
            const uint8_t* cp = (const uint8_t*)(longword_ptr - 1);

            if (*cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
#if SX_ARCH_64BIT
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
#endif
        }
    }

    return NULL;
}